

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeBody::ComputeQ(ChLoadXYZnodeBody *this,ChState *state_x,ChStateDelta *state_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer psVar5;
  element_type *peVar6;
  double dVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  ChFrameMoving<double> *pCVar10;
  double *pdVar11;
  Index index;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  _func_int **pp_Var34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ChVector<double> loc_ftorque;
  ChVector<double> abs_force;
  ChFrameMoving<double> rel_AB;
  ChFrameMoving<double> bodycoordB;
  ChFrameMoving<double> bodycoordA;
  long local_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  ChQuaternion<double> local_458;
  undefined1 local_438 [192];
  ChCoordsys<double> CStack_378;
  ChFrameMoving<double> local_338;
  ChFrameMoving<double> local_240;
  ChVector<double> local_148;
  ChFrameMoving<double> local_128;
  
  psVar5 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = (psVar5->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    pCVar10 = (ChFrameMoving<double> *)0x0;
  }
  else {
    pCVar10 = (ChFrameMoving<double> *)
              __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo);
  }
  if (pCVar10 == (ChFrameMoving<double> *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pCVar10 = (ChFrameMoving<double> *)0x0;
  }
  else {
    this_00 = (psVar5->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  psVar5 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = psVar5[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    local_480 = 0;
  }
  else {
    local_480 = __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
  }
  if (local_480 == 0) {
    local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_480 = 0;
  }
  else {
    local_478 = psVar5[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_478->_M_use_count = local_478->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_478->_M_use_count = local_478->_M_use_count + 1;
      }
    }
  }
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_240.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_240.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_240.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_240.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_338,(ChQuaternion<double> *)&local_240);
  local_438._16_8_ = 0.0;
  local_438._0_8_ = (_func_int **)0x0;
  local_438._8_8_ = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_240,(ChVector<double> *)local_438,(ChQuaternion<double> *)&local_338);
  if (state_x == (ChState *)0x0) {
    if (&local_128 != pCVar10) {
      local_128.super_ChFrame<double>.coord.pos.m_data[0] =
           (pCVar10->super_ChFrame<double>).coord.pos.m_data[0];
      local_128.super_ChFrame<double>.coord.pos.m_data[1] =
           (pCVar10->super_ChFrame<double>).coord.pos.m_data[1];
      local_128.super_ChFrame<double>.coord.pos.m_data[2] =
           (pCVar10->super_ChFrame<double>).coord.pos.m_data[2];
    }
    ChFrame<double>::SetCoord
              (&local_240.super_ChFrame<double>,(ChCoordsys<double> *)(local_480 + 0x80));
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_x;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_005df67a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.super_ChFrame<double>.coord.pos.m_data[0] = (double)local_438._0_8_;
    local_128.super_ChFrame<double>.coord.pos.m_data[1] = (double)local_438._8_8_;
    local_128.super_ChFrame<double>.coord.pos.m_data[2] = (double)local_438._16_8_;
    local_438._48_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_438._0_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
    local_438._8_8_ = 3.45845952088873e-323;
    local_438._32_8_ = 1.48219693752374e-323;
    local_438._24_8_ = state_x;
    if ((long)local_438._48_8_ < 10) goto LAB_005df67a;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_438,(type *)0x0);
    ChFrame<double>::SetCoord(&local_240.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_128.coord_dt != (ChCoordsys<double> *)&(pCVar10->super_ChFrame<double>).coord.rot) {
      local_128.coord_dt.pos.m_data[0] = (pCVar10->super_ChFrame<double>).coord.rot.m_data[0];
      local_128.coord_dt.pos.m_data[1] = (pCVar10->super_ChFrame<double>).coord.rot.m_data[1];
      local_128.coord_dt.pos.m_data[2] = (pCVar10->super_ChFrame<double>).coord.rot.m_data[2];
    }
    if (&local_240.coord_dt != (ChCoordsys<double> *)(local_480 + 0x100)) {
      local_240.coord_dt.pos.m_data[0] = *(double *)(local_480 + 0x100);
      local_240.coord_dt.pos.m_data[1] = *(double *)(local_480 + 0x108);
      local_240.coord_dt.pos.m_data[2] = *(double *)(local_480 + 0x110);
      local_240.coord_dt.rot.m_data[0] = *(double *)(local_480 + 0x118);
      local_240.coord_dt.rot.m_data[1] = *(double *)(local_480 + 0x120);
      local_240.coord_dt.rot.m_data[2] = *(double *)(local_480 + 0x128);
      local_240.coord_dt.rot.m_data[3] = *(double *)(local_480 + 0x130);
    }
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_005df67a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.coord_dt.pos.m_data[0] = (double)local_438._0_8_;
    local_128.coord_dt.pos.m_data[1] = (double)local_438._8_8_;
    local_128.coord_dt.pos.m_data[2] = (double)local_438._16_8_;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 6) goto LAB_005df67a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_240.coord_dt.pos.m_data[0] = (double)local_438._0_8_;
    local_240.coord_dt.pos.m_data[1] = (double)local_438._8_8_;
    local_240.coord_dt.pos.m_data[2] = (double)local_438._16_8_;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 6);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 2.96439387504748e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 9) goto LAB_005df67a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_240,(ChVector<double> *)local_438);
  }
  ChFrameMoving<double>::operator=(&this->frame_Aw,&local_128);
  local_438._8_8_ = (this->loc_application_B).coord.pos.m_data[0];
  local_438._16_8_ = (this->loc_application_B).coord.pos.m_data[1];
  local_438._24_8_ = (this->loc_application_B).coord.pos.m_data[2];
  local_438._32_8_ = (this->loc_application_B).coord.rot.m_data[0];
  local_438._40_8_ = (this->loc_application_B).coord.rot.m_data[1];
  local_438._48_8_ = (this->loc_application_B).coord.rot.m_data[2];
  local_438._56_8_ = (this->loc_application_B).coord.rot.m_data[3];
  local_438._64_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_438._72_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_438._80_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_438._88_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_438._96_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_438._104_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_438._112_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_438._120_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_438._128_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_438._0_8_ = &PTR__ChFrame_00b2b278;
  local_438._136_8_ = 0.0;
  local_438._144_8_ = 0.0;
  local_438._152_8_ = 0.0;
  local_438._160_8_ = 0.0;
  local_438._168_8_ = 0.0;
  local_438._176_8_ = 0.0;
  CStack_378 = SUB6456(ZEXT464(0),0);
  local_438._184_8_ = 0.0;
  local_148.m_data[2] = 0.0;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = 0.0;
  local_458.m_data[0] = 1.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = 0.0;
  local_458.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_148,&local_458);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_240,(ChFrameMoving<double> *)local_438,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&local_338);
  local_438._8_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0];
  local_438._16_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1];
  local_438._24_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2];
  local_438._32_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[0];
  local_438._40_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[1];
  local_438._48_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[2];
  local_438._56_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[3];
  local_438._64_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_438._72_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_438._80_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_438._88_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_438._96_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_438._104_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_438._112_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_438._120_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_438._128_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_438._0_8_ = &PTR__ChFrame_00b2b278;
  local_438._136_8_ = (this->frame_Bw).coord_dt.pos.m_data[0];
  local_438._144_8_ = (this->frame_Bw).coord_dt.pos.m_data[1];
  local_438._152_8_ = (this->frame_Bw).coord_dt.pos.m_data[2];
  local_438._160_8_ = (this->frame_Bw).coord_dt.rot.m_data[0];
  local_438._168_8_ = (this->frame_Bw).coord_dt.rot.m_data[1];
  local_438._176_8_ = (this->frame_Bw).coord_dt.rot.m_data[2];
  unique0x10000e41 = *(undefined1 (*) [64])((this->frame_Bw).coord_dt.rot.m_data + 3);
  ChFrameMoving<double>::Invert((ChFrameMoving<double> *)local_438);
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = 0.0;
  local_148.m_data[2] = 0.0;
  local_458.m_data[0] = 1.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = 0.0;
  local_458.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_148,&local_458);
  ChFrameMoving<double>::TransformLocalToParent
            ((ChFrameMoving<double> *)local_438,&this->frame_Aw,&local_338);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_338,&this->computed_loc_force);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (this->computed_loc_force).m_data[0];
  dVar22 = (this->computed_loc_force).m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       dVar22 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar15 = vfmadd231sd_fma(auVar35,auVar17,auVar15);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (this->computed_loc_force).m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar15 = vfmadd231sd_fma(auVar15,auVar30,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       dVar22 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar1 = vfmadd231sd_fma(auVar39,auVar17,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar1 = vfmadd231sd_fma(auVar1,auVar30,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       dVar22 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar2 = vfmadd231sd_fma(auVar23,auVar17,auVar4);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar2 = vfmadd231sd_fma(auVar2,auVar30,auVar49);
  pp_Var34 = auVar15._0_8_;
  local_438._0_8_ = pp_Var34;
  dVar37 = auVar1._0_8_;
  local_438._8_8_ = dVar37;
  dVar22 = auVar2._0_8_;
  local_438._16_8_ = dVar22;
  if (2 < (this->super_ChLoadCustomMultiple).load_Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar11 = (this->super_ChLoadCustomMultiple).load_Q.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar14 = 3;
    if ((((ulong)pdVar11 & 7) == 0) &&
       (uVar9 = -((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7, uVar9 < 3)) {
      uVar14 = uVar9;
    }
    if (uVar14 != 0) {
      memcpy(pdVar11,local_438,(ulong)(uVar14 * 8));
    }
    if (uVar14 < 3) {
      uVar12 = (ulong)(uVar14 << 3);
      memcpy((void *)((long)pdVar11 + uVar12),local_438 + uVar12,0x18 - uVar12);
    }
    dVar16 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0] -
             local_240.super_ChFrame<double>.coord.pos.m_data[0];
    dVar38 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1] -
             local_240.super_ChFrame<double>.coord.pos.m_data[1];
    dVar7 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
            local_240.super_ChFrame<double>.coord.pos.m_data[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar37;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar22;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar38;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar37 * dVar7;
    auVar2 = vfmsub231sd_fma(auVar36,auVar24,auVar40);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = pp_Var34;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar7;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar22 * dVar16;
    auVar1 = vfmsub231sd_fma(auVar41,auVar43,auVar31);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (double)pp_Var34 * dVar38;
    auVar4 = vfmsub231sd_fma(auVar25,auVar18,auVar44);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_240.super_ChFrame<double>.coord.rot.m_data[0];
    local_240.super_ChFrame<double>.coord.rot.m_data[0] =
         local_240.super_ChFrame<double>.coord.rot.m_data[0] *
         local_240.super_ChFrame<double>.coord.rot.m_data[0];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar19,auVar8);
    dVar16 = auVar15._0_8_;
    auVar49 = ZEXT816(0xbff0000000000000);
    auVar17 = ZEXT816(0x4000000000000000);
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         local_240.super_ChFrame<double>.coord.rot.m_data[0] +
         local_240.super_ChFrame<double>.coord.rot.m_data[1] *
         local_240.super_ChFrame<double>.coord.rot.m_data[1];
    auVar15 = vfmadd213sd_fma(auVar45,auVar17,auVar49);
    dVar22 = local_240.super_ChFrame<double>.coord.rot.m_data[1] *
             local_240.super_ChFrame<double>.coord.rot.m_data[2] -
             local_240.super_ChFrame<double>.coord.rot.m_data[3] * dVar16;
    dVar38 = auVar1._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (dVar22 + dVar22) * dVar38;
    auVar15 = vfmadd231sd_fma(auVar50,auVar2,auVar15);
    dVar22 = local_240.super_ChFrame<double>.coord.rot.m_data[2] * dVar16 +
             local_240.super_ChFrame<double>.coord.rot.m_data[3] *
             local_240.super_ChFrame<double>.coord.rot.m_data[1];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar22 + dVar22;
    auVar15 = vfmadd213sd_fma(auVar46,auVar4,auVar15);
    dVar22 = local_240.super_ChFrame<double>.coord.rot.m_data[1] *
             local_240.super_ChFrame<double>.coord.rot.m_data[2] +
             local_240.super_ChFrame<double>.coord.rot.m_data[3] * dVar16;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_240.super_ChFrame<double>.coord.rot.m_data[2] *
         local_240.super_ChFrame<double>.coord.rot.m_data[2] +
         local_240.super_ChFrame<double>.coord.rot.m_data[0];
    auVar1 = vfmadd213sd_fma(auVar47,auVar17,auVar49);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar22 + dVar22;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar1._0_8_ * dVar38;
    auVar1 = vfmadd231sd_fma(auVar48,auVar2,auVar20);
    dVar22 = local_240.super_ChFrame<double>.coord.rot.m_data[3] *
             local_240.super_ChFrame<double>.coord.rot.m_data[2] -
             local_240.super_ChFrame<double>.coord.rot.m_data[1] * dVar16;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar22 + dVar22;
    auVar1 = vfmadd213sd_fma(auVar21,auVar4,auVar1);
    dVar37 = local_240.super_ChFrame<double>.coord.rot.m_data[3] *
             local_240.super_ChFrame<double>.coord.rot.m_data[1] -
             local_240.super_ChFrame<double>.coord.rot.m_data[2] * dVar16;
    dVar22 = local_240.super_ChFrame<double>.coord.rot.m_data[1] * dVar16 +
             local_240.super_ChFrame<double>.coord.rot.m_data[3] *
             local_240.super_ChFrame<double>.coord.rot.m_data[2];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar37 + dVar37;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar38 * (dVar22 + dVar22);
    auVar3 = vfmadd231sd_fma(auVar42,auVar2,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         local_240.super_ChFrame<double>.coord.rot.m_data[3] *
         local_240.super_ChFrame<double>.coord.rot.m_data[3] +
         local_240.super_ChFrame<double>.coord.rot.m_data[0];
    auVar2 = vfmadd213sd_fma(auVar33,auVar17,auVar49);
    auVar2 = vfmadd213sd_fma(auVar2,auVar4,auVar3);
    local_458.m_data[0] = auVar15._0_8_;
    local_458.m_data[1] = auVar1._0_8_;
    local_458.m_data[2] = auVar2._0_8_;
    if (5 < (this->super_ChLoadCustomMultiple).load_Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar11 = (this->super_ChLoadCustomMultiple).load_Q.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
      uVar12 = 3;
      if ((((ulong)pdVar11 & 7) == 0) &&
         (uVar13 = (ulong)(-((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7), uVar13 < 3)) {
        uVar12 = uVar13;
      }
      if (uVar12 != 0) {
        uVar13 = 0;
        do {
          auVar26._0_8_ = *(ulong *)(local_438 + uVar13 * 8) ^ 0x8000000000000000;
          auVar26._8_8_ = 0x8000000000000000;
          dVar22 = (double)vmovlpd_avx(auVar26);
          pdVar11[uVar13] = dVar22;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      if (uVar12 < 3) {
        do {
          auVar27._0_8_ = *(ulong *)(local_438 + uVar12 * 8) ^ 0x8000000000000000;
          auVar27._8_8_ = 0x8000000000000000;
          dVar22 = (double)vmovlpd_avx(auVar27);
          pdVar11[uVar12] = dVar22;
          uVar12 = uVar12 + 1;
        } while (uVar12 != 3);
      }
      if (8 < (this->super_ChLoadCustomMultiple).load_Q.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pdVar11 = (this->super_ChLoadCustomMultiple).load_Q.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                  6;
        uVar12 = 3;
        if ((((ulong)pdVar11 & 7) == 0) &&
           (uVar13 = (ulong)(-((uint)((ulong)pdVar11 >> 3) & 0x1fffffff) & 7), uVar13 < 3)) {
          uVar12 = uVar13;
        }
        if (uVar12 != 0) {
          uVar13 = 0;
          do {
            auVar28._0_8_ = -local_458.m_data[uVar13];
            auVar28._8_8_ = 0x8000000000000000;
            dVar22 = (double)vmovlpd_avx(auVar28);
            pdVar11[uVar13] = dVar22;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        if (uVar12 < 3) {
          do {
            auVar29._0_8_ = -local_458.m_data[uVar12];
            auVar29._8_8_ = 0x8000000000000000;
            dVar22 = (double)vmovlpd_avx(auVar29);
            pdVar11[uVar12] = dVar22;
            uVar12 = uVar12 + 1;
          } while (uVar12 != 3);
        }
        if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        return;
      }
    }
  }
LAB_005df67a:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadXYZnodeBody::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetPos(state_x->segment(0, 3));
        bodycoordB.SetCoord(state_x->segment(3, 7));
    } else {
        bodycoordA.SetPos(mnodeA->pos);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordB.SetPos_dt(state_w->segment(3, 3));
        bodycoordB.SetWvel_loc(state_w->segment(6, 3));
    } else {
        bodycoordA.SetPos_dt(mnodeA->GetPos_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForce(rel_AB, computed_loc_force);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(computed_loc_force);

    // Compute Q
    load_Q.segment(0, 3) = abs_force.eigen();

    ChVector<> loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    load_Q.segment(3, 3) = -abs_force.eigen();
    load_Q.segment(6, 3) = -loc_ftorque.eigen();
}